

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O0

domain_manager * __thiscall
cs::domain_manager::add_buildin_type<char_const(&)[8]>
          (domain_manager *this,char (*name) [8],function<cs_impl::any_()> *func,type_index *id)

{
  domain_manager *pdVar1;
  function<cs_impl::any_()> *in_RSI;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  var *in_stack_00000100;
  char (*in_stack_00000108) [8];
  domain_manager *in_stack_00000110;
  char (*in_stack_ffffffffffffff68) [8];
  allocator local_41;
  string local_40 [8];
  string *in_stack_ffffffffffffffc8;
  domain_manager *in_stack_ffffffffffffffd0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,(char *)in_RSI,&local_41);
  add_record(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  phmap::priv::
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::emplace<const_char_(&)[8],_0>(in_RDI,in_stack_ffffffffffffff68);
  cs_impl::any::make_protect<cs::type_t,std::function<cs_impl::any()>const&,std::type_index_const&>
            (in_RSI,(type_index *)in_RDI);
  pdVar1 = add_var<char_const(&)[8]>(in_stack_00000110,in_stack_00000108,in_stack_00000100);
  cs_impl::any::~any((any *)0x542305);
  return pdVar1;
}

Assistant:

domain_manager &add_buildin_type(T &&name, const std::function<var()> &func, const std::type_index &id)
		{
			add_record(name);
			buildin_symbols.emplace(name);
			return add_var(name, var::make_protect<type_t>(func, id));
		}